

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getChromaticities(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  invalid_argument *this;
  Chromaticities *__a;
  float *pfVar1;
  long lVar2;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  float fVar3;
  double dVar4;
  ChromaticitiesAttribute *a;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  Vec2<float> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_d9;
  string local_d8 [80];
  Vec2<float> local_88;
  Vec2<float> local_80;
  undefined1 local_78 [48];
  Chromaticities *local_48;
  int *local_20;
  long local_18;
  
  if (in_ESI + -9 < *in_RCX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Expected 8 chromaticity values");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  __a = (Chromaticities *)operator_new(0x28);
  this_00 = (Vec2<float> *)(local_78 + 8);
  Imath_3_2::Vec2<float>::Vec2(this_00,0.64,0.33);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  Imath_3_2::Vec2<float>::Vec2((Vec2<float> *)this_01,0.3,0.6);
  Imath_3_2::Vec2<float>::Vec2(&local_80,0.15,0.06);
  Imath_3_2::Vec2<float>::Vec2(&local_88,0.3127,0.329);
  Imf_3_4::Chromaticities::Chromaticities
            ((Chromaticities *)(local_78 + 0x10),(Vec2 *)this_00,(Vec2 *)this_01,(Vec2 *)&local_80,
             (Vec2 *)&local_88);
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute(__a);
  local_48 = __a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)this_00,(allocator<char> *)__a)
  ;
  SetAttr::SetAttr((SetAttr *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (string *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec4,
                   (Attribute *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back
            ((vector<SetAttr,_std::allocator<SetAttr>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (value_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  SetAttr::~SetAttr((SetAttr *)0x106a7a);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  dVar4 = strtod(*(char **)(local_18 + (long)(*local_20 + 1) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  pfVar1 = (float *)Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
  *pfVar1 = fVar3;
  dVar4 = strtod(*(char **)(local_18 + (long)(*local_20 + 2) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
  *(float *)(lVar2 + 4) = fVar3;
  dVar4 = strtod(*(char **)(local_18 + (long)(*local_20 + 3) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
  *(float *)(lVar2 + 8) = fVar3;
  dVar4 = strtod(*(char **)(local_18 + (long)(*local_20 + 4) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
  *(float *)(lVar2 + 0xc) = fVar3;
  dVar4 = strtod(*(char **)(local_18 + (long)(*local_20 + 5) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
  *(float *)(lVar2 + 0x10) = fVar3;
  dVar4 = strtod(*(char **)(local_18 + (long)(*local_20 + 6) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
  *(float *)(lVar2 + 0x14) = fVar3;
  dVar4 = strtod(*(char **)(local_18 + (long)(*local_20 + 7) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
  *(float *)(lVar2 + 0x18) = fVar3;
  dVar4 = strtod(*(char **)(local_18 + (long)(*local_20 + 8) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::value();
  *(float *)(lVar2 + 0x1c) = fVar3;
  *local_20 = *local_20 + 9;
  return;
}

Assistant:

void
getChromaticities (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 9) throw invalid_argument ("Expected 8 chromaticity values");

    ChromaticitiesAttribute* a =
        new ChromaticitiesAttribute (Chromaticities ());
    attrs.push_back (SetAttr (attrName, part, a));

    a->value ().red.x   = static_cast<float> (strtod (argv[i + 1], 0));
    a->value ().red.y   = static_cast<float> (strtod (argv[i + 2], 0));
    a->value ().green.x = static_cast<float> (strtod (argv[i + 3], 0));
    a->value ().green.y = static_cast<float> (strtod (argv[i + 4], 0));
    a->value ().blue.x  = static_cast<float> (strtod (argv[i + 5], 0));
    a->value ().blue.y  = static_cast<float> (strtod (argv[i + 6], 0));
    a->value ().white.x = static_cast<float> (strtod (argv[i + 7], 0));
    a->value ().white.y = static_cast<float> (strtod (argv[i + 8], 0));
    i += 9;
}